

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O0

bool QtPrivate::
     q_points_into_range<QArrayDataPointer<QPersistentModelIndex>,QPersistentModelIndex_const*>
               (QPersistentModelIndex **p,QArrayDataPointer<QPersistentModelIndex> *c)

{
  undefined8 uVar1;
  bool bVar2;
  QPersistentModelIndex *__last;
  QPersistentModelIndex *pQVar3;
  difference_type dVar4;
  undefined8 *in_RDI;
  QPersistentModelIndex *in_stack_ffffffffffffffe8;
  
  uVar1 = *in_RDI;
  __last = std::data<QArrayDataPointer<QPersistentModelIndex>>
                     ((QArrayDataPointer<QPersistentModelIndex> *)0x8d8075);
  pQVar3 = std::data<QArrayDataPointer<QPersistentModelIndex>>
                     ((QArrayDataPointer<QPersistentModelIndex> *)0x8d8084);
  std::begin<QArrayDataPointer<QPersistentModelIndex>>
            ((QArrayDataPointer<QPersistentModelIndex> *)0x8d8093);
  std::end<QArrayDataPointer<QPersistentModelIndex>>
            ((QArrayDataPointer<QPersistentModelIndex> *)0x8d80a1);
  dVar4 = std::distance<QPersistentModelIndex_const*>(in_stack_ffffffffffffffe8,__last);
  bVar2 = q_points_into_range<QPersistentModelIndex,std::less<void>>(uVar1,__last,pQVar3 + dVar4);
  return bVar2;
}

Assistant:

static constexpr bool q_points_into_range(const T &p, const C &c) noexcept
{
    static_assert(std::is_same_v<decltype(std::data(c)), T>);

    // std::distance because QArrayDataPointer has a "qsizetype size"
    // member but no size() function
    return q_points_into_range(p, std::data(c),
                               std::data(c) + std::distance(std::begin(c), std::end(c)));
}